

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyExporter.cpp
# Opt level: O3

void __thiscall
Assimp::PlyExporter::PlyExporter(PlyExporter *this,char *_filename,aiScene *pScene,bool binary)

{
  uint uVar1;
  aiMesh *paVar2;
  aiMaterial *pMat;
  uint uVar3;
  undefined4 uVar4;
  aiScene *paVar5;
  aiReturn aVar6;
  ostream *poVar7;
  size_t sVar8;
  PlyExporter *pPVar9;
  uint uVar10;
  undefined7 in_register_00000009;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  aiString s;
  locale alStack_478 [12];
  undefined4 local_46c;
  ulong local_468;
  ulong local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_458;
  string *local_450;
  aiScene *local_448;
  locale local_440 [12];
  aiString local_434;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::__cxx11::string::string((string *)&this->filename,_filename,(allocator *)&local_434);
  local_450 = &this->endl;
  local_458 = &(this->endl).field_2;
  (this->endl)._M_dataplus._M_p = (pointer)local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"\n","");
  std::locale::locale(alStack_478,"C");
  std::ios::imbue(local_440);
  std::locale::~locale(local_440);
  *(undefined8 *)(&this->field_0x8 + *(long *)(*(long *)this + -0x18)) = 8;
  if ((ulong)pScene->mNumMeshes == 0) {
    local_460 = 0;
    uVar16 = 0;
    local_468 = 0;
  }
  else {
    uVar12 = 0;
    uVar14 = 0;
    uVar16 = 0;
    uVar15 = 0;
    do {
      paVar2 = pScene->mMeshes[uVar12];
      uVar1 = paVar2->mNumVertices;
      uVar10 = (uVar1 != 0 && paVar2->mNormals != (aiVector3D *)0x0) | uVar16;
      uVar3 = uVar10 | 2;
      if (uVar1 == 0) {
        uVar3 = uVar16;
      }
      uVar14 = uVar14 + paVar2->mNumFaces;
      uVar15 = uVar15 + uVar1;
      if (paVar2->mBitangents == (aiVector3D *)0x0) {
        uVar3 = uVar10;
      }
      uVar16 = uVar3;
      if (paVar2->mTangents == (aiVector3D *)0x0) {
        uVar16 = uVar10;
      }
      lVar11 = 0;
      do {
        if ((uVar1 == 0) || (paVar2->mTextureCoords[lVar11] == (aiVector3D *)0x0)) break;
        uVar16 = 4 << ((byte)lVar11 & 0x1f) | uVar16;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 8);
      lVar11 = 0;
      do {
        if ((uVar1 == 0) || (paVar2->mColors[lVar11] == (aiColor4D *)0x0)) break;
        uVar16 = uVar16 | 0x400 << ((byte)lVar11 & 0x1f);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 8);
      uVar12 = uVar12 + 1;
    } while (uVar12 != pScene->mNumMeshes);
    local_460 = (ulong)uVar15;
    local_468 = (ulong)uVar14;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"ply",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  pcVar13 = "format ascii 1.0";
  if (binary) {
    pcVar13 = "format binary_little_endian 1.0";
  }
  lVar11 = 0x10;
  if (binary) {
    lVar11 = 0x1f;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,pcVar13,lVar11);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,
             "comment Created by Open Asset Import Library - http://assimp.sf.net (v",0x46);
  aiGetVersionMajor();
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)this);
  local_434.length._0_1_ = 0x2e;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_434,1);
  aiGetVersionMinor();
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  local_434.length = CONCAT31(local_434.length._1_3_,0x2e);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_434,1);
  aiGetVersionRevision();
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  local_46c = (undefined4)CONCAT71(in_register_00000009,binary);
  if (pScene->mNumMaterials != 0) {
    uVar12 = 0;
    do {
      pMat = pScene->mMaterials[uVar12];
      local_434.length = 0;
      local_434.data[0] = '\0';
      memset(local_434.data + 1,0x1b,0x3ff);
      aVar6 = aiGetMaterialString(pMat,"$tex.file",1,0,&local_434);
      if (aVar6 == aiReturn_SUCCESS) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,"comment TextureFile ",0x14);
        sVar8 = strlen(local_434.data);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,local_434.data,sVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < pScene->mNumMaterials);
  }
  local_448 = pScene;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"element vertex ",0xf);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)this);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"float",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," x",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"float",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," y",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"float",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," z",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  if ((uVar16 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"float",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," nx",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"float",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ny",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"float",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," nz",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  }
  if ((uVar16 & 4) != 0) {
    uVar14 = 4;
    lVar11 = 0;
    do {
      if (lVar11 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"float",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," s",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"float",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," t",2);
        pPVar9 = this;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"float",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," s",2);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)this);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"float",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," t",2);
        pPVar9 = (PlyExporter *)std::ostream::_M_insert<unsigned_long>((ulong)this);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pPVar9,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      uVar14 = uVar14 * 2;
    } while (((uVar14 & uVar16) != 0) && (bVar17 = lVar11 != 7, lVar11 = lVar11 + 1, bVar17));
  }
  if ((uVar16 >> 10 & 1) != 0) {
    uVar14 = 0x400;
    lVar11 = 0;
    do {
      if (lVar11 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"uchar",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," red",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"uchar",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," green",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"uchar",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," blue",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"uchar",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," alpha",6);
        pPVar9 = this;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"uchar",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," red",4);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)this);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"uchar",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," green",6);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)this);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"uchar",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," blue",5);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)this);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"uchar",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," alpha",6);
        pPVar9 = (PlyExporter *)std::ostream::_M_insert<unsigned_long>((ulong)this);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pPVar9,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      uVar14 = uVar14 * 2;
    } while (((uVar14 & uVar16) != 0) && (bVar17 = lVar11 != 7, lVar11 = lVar11 + 1, bVar17));
  }
  if ((uVar16 & 2) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"float",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," tx",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"float",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ty",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"float",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," tz",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"float",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," bx",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"float",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," by",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"property ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"float",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," bz",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"element face ",0xd);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)this);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,"property list uchar int vertex_index",0x24);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"end_header",10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  paVar5 = local_448;
  uVar4 = local_46c;
  if (local_448->mNumMeshes != 0) {
    uVar12 = 0;
    do {
      if ((char)uVar4 == '\0') {
        WriteMeshVerts(this,paVar5->mMeshes[uVar12],uVar16);
      }
      else {
        WriteMeshVertsBinary(this,paVar5->mMeshes[uVar12],uVar16);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < paVar5->mNumMeshes);
    if (paVar5->mNumMeshes != 0) {
      uVar12 = 0;
      uVar16 = 0;
      do {
        if ((char)uVar4 == '\0') {
          WriteMeshIndices(this,paVar5->mMeshes[uVar12],uVar16);
        }
        else {
          WriteMeshIndicesBinary_Generic<unsigned_char,int>
                    (paVar5->mMeshes[uVar12],uVar16,&this->mOutput);
        }
        uVar16 = uVar16 + paVar5->mMeshes[uVar12]->mNumVertices;
        uVar12 = uVar12 + 1;
      } while (uVar12 < paVar5->mNumMeshes);
    }
  }
  std::locale::~locale(alStack_478);
  return;
}

Assistant:

PlyExporter::PlyExporter(const char* _filename, const aiScene* pScene, bool binary)
: filename(_filename)
, endl("\n")
{
    // make sure that all formatting happens using the standard, C locale and not the user's current locale
    const std::locale& l = std::locale("C");
    mOutput.imbue(l);
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION);

    unsigned int faces = 0u, vertices = 0u, components = 0u;
    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        const aiMesh& m = *pScene->mMeshes[i];
        faces += m.mNumFaces;
        vertices += m.mNumVertices;

        if (m.HasNormals()) {
            components |= PLY_EXPORT_HAS_NORMALS;
        }
        if (m.HasTangentsAndBitangents()) {
            components |= PLY_EXPORT_HAS_TANGENTS_BITANGENTS;
        }
        for (unsigned int t = 0; m.HasTextureCoords(t); ++t) {
            components |= PLY_EXPORT_HAS_TEXCOORDS << t;
        }
        for (unsigned int t = 0; m.HasVertexColors(t); ++t) {
            components |= PLY_EXPORT_HAS_COLORS << t;
        }
    }

    mOutput << "ply" << endl;
    if (binary) {
#if (defined AI_BUILD_BIG_ENDIAN)
        mOutput << "format binary_big_endian 1.0" << endl;
#else
        mOutput << "format binary_little_endian 1.0" << endl;
#endif
    }
    else {
        mOutput << "format ascii 1.0" << endl;
    }
    mOutput << "comment Created by Open Asset Import Library - http://assimp.sf.net (v"
        << aiGetVersionMajor() << '.' << aiGetVersionMinor() << '.'
        << aiGetVersionRevision() << ")" << endl;

    // Look through materials for a diffuse texture, and add it if found
    for ( unsigned int i = 0; i < pScene->mNumMaterials; ++i )
    {
        const aiMaterial* const mat = pScene->mMaterials[i];
        aiString s;
        if ( AI_SUCCESS == mat->Get( AI_MATKEY_TEXTURE_DIFFUSE( 0 ), s ) )
        {
            mOutput << "comment TextureFile " << s.data << endl;
        }
    }

    // TODO: probably want to check here rather than just assume something
    //       definitely not good to always write float even if we might have double precision

    ai_real tmp = 0.0;
    const char * typeName = type_of(tmp);

    mOutput << "element vertex " << vertices << endl;
    mOutput << "property " << typeName << " x" << endl;
    mOutput << "property " << typeName << " y" << endl;
    mOutput << "property " << typeName << " z" << endl;

    if(components & PLY_EXPORT_HAS_NORMALS) {
        mOutput << "property " << typeName << " nx" << endl;
        mOutput << "property " << typeName << " ny" << endl;
        mOutput << "property " << typeName << " nz" << endl;
    }

    // write texcoords first, just in case an importer does not support tangents
    // bitangents and just skips over the rest of the line upon encountering
    // unknown fields (Ply leaves pretty much every vertex component open,
    // but in reality most importers only know about vertex positions, normals
    // and texture coordinates).
    for (unsigned int n = PLY_EXPORT_HAS_TEXCOORDS, c = 0; (components & n) && c != AI_MAX_NUMBER_OF_TEXTURECOORDS; n <<= 1, ++c) {
        if (!c) {
            mOutput << "property " << typeName << " s" << endl;
            mOutput << "property " << typeName << " t" << endl;
        }
        else {
            mOutput << "property " << typeName << " s" << c << endl;
            mOutput << "property " << typeName << " t" << c << endl;
        }
    }

    for (unsigned int n = PLY_EXPORT_HAS_COLORS, c = 0; (components & n) && c != AI_MAX_NUMBER_OF_COLOR_SETS; n <<= 1, ++c) {
        if (!c) {
            mOutput << "property " << "uchar" << " red" << endl;
            mOutput << "property " << "uchar" << " green" << endl;
            mOutput << "property " << "uchar" << " blue" << endl;
            mOutput << "property " << "uchar" << " alpha" << endl;
        }
        else {
            mOutput << "property " << "uchar" << " red" << c << endl;
            mOutput << "property " << "uchar" << " green" << c << endl;
            mOutput << "property " << "uchar" << " blue" << c << endl;
            mOutput << "property " << "uchar" << " alpha" << c << endl;
        }
    }

    if(components & PLY_EXPORT_HAS_TANGENTS_BITANGENTS) {
        mOutput << "property " << typeName << " tx" << endl;
        mOutput << "property " << typeName << " ty" << endl;
        mOutput << "property " << typeName << " tz" << endl;
        mOutput << "property " << typeName << " bx" << endl;
        mOutput << "property " << typeName << " by" << endl;
        mOutput << "property " << typeName << " bz" << endl;
    }

    mOutput << "element face " << faces << endl;

    // uchar seems to be the most common type for the number of indices per polygon and int seems to be most common for the vertex indices.
    // For instance, MeshLab fails to load meshes in which both types are uint. Houdini seems to have problems as well.
    // Obviously, using uchar will not work for meshes with polygons with more than 255 indices, but how realistic is this case?
    mOutput << "property list uchar int vertex_index" << endl;

    mOutput << "end_header" << endl;

    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        if (binary) {
            WriteMeshVertsBinary(pScene->mMeshes[i], components);
        }
        else {
            WriteMeshVerts(pScene->mMeshes[i], components);
        }
    }
    for (unsigned int i = 0, ofs = 0; i < pScene->mNumMeshes; ++i) {
        if (binary) {
            WriteMeshIndicesBinary(pScene->mMeshes[i], ofs);
        }
        else {
            WriteMeshIndices(pScene->mMeshes[i], ofs);
        }
        ofs += pScene->mMeshes[i]->mNumVertices;
    }
}